

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * AI::create_Wait(Task *__return_storage_ptr__,float time)

{
  value_type local_58;
  anon_class_4_1_8991ffcb local_50 [5];
  allocator<char> local_39;
  string local_38;
  undefined1 local_15;
  float local_14;
  Task *pTStack_10;
  float time_local;
  Task *wait;
  
  local_15 = 0;
  local_14 = time;
  pTStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"wait",&local_39);
  Task::Task(__return_storage_ptr__,&local_38,Simple);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  __return_storage_ptr__->action = Wait;
  std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::resize
            (&(__return_storage_ptr__->parameters).vectors,1);
  local_50[0].time = local_14;
  std::function<void(AI::Task&,AI::WorldState&,AI::WorldQuerier_const&)>::operator=
            ((function<void(AI::Task&,AI::WorldState&,AI::WorldQuerier_const&)> *)
             &__return_storage_ptr__->setup,local_50);
  local_58.identifier = TimeElapsed;
  local_58.index = 0;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  push_back(&(__return_storage_ptr__->postconditions).satisfiedPredicates,&local_58);
  return __return_storage_ptr__;
}

Assistant:

Task create_Wait(float time)
	{
		Task wait {"wait"};		
		wait.action = Action::Wait;
		wait.parameters.vectors.resize(1);
		wait.setup = [=](Task& task, const WorldState& state, const WorldQuerier&)
		{
			//parameters.vectors[0] is {current alarm time, total alarm time, UNUSED}
			task.parameters.vectors[0].x = 0;
			task.parameters.vectors[0].y = time;
		};
		
		wait.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::TimeElapsed, 0});

		return wait;
	}